

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::hugeint_t,unsigned_int,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::ExtractVersionUuidOperator>>
               (hugeint_t *ldata,uint *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  hugeint_t input;
  bool bVar1;
  uint uVar2;
  idx_t iVar3;
  hugeint_t *phVar4;
  SelectionVector *in_RCX;
  ValidityMask *in_RDX;
  long in_RSI;
  long in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  idx_t idx_1;
  idx_t i_1;
  idx_t idx;
  idx_t i;
  idx_t in_stack_ffffffffffffff88;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff90;
  idx_t in_stack_ffffffffffffff98;
  ValidityMask *in_stack_ffffffffffffffa0;
  ValidityMask *mask_00;
  uint64_t in_stack_ffffffffffffffa8;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb0;
  ValidityMask *local_40;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_R8);
  if (bVar1) {
    for (mask_00 = (ValidityMask *)0x0; mask_00 < in_RDX;
        mask_00 = (ValidityMask *)
                  ((long)&(mask_00->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1))
    {
      iVar3 = SelectionVector::get_index(in_RCX,(idx_t)mask_00);
      input.upper = (int64_t)in_stack_ffffffffffffffb0;
      input.lower = in_stack_ffffffffffffffa8;
      uVar2 = GenericUnaryWrapper::
              Operation<duckdb::UnaryStringOperator<duckdb::ExtractVersionUuidOperator>,duckdb::hugeint_t,unsigned_int>
                        (input,mask_00,iVar3,*(void **)(in_RDI + iVar3 * 0x10 + 8));
      *(uint *)(in_RSI + (long)mask_00 * 4) = uVar2;
    }
  }
  else {
    for (local_40 = (ValidityMask *)0x0; local_40 < in_RDX;
        local_40 = (ValidityMask *)
                   ((long)&(local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)
        ) {
      iVar3 = SelectionVector::get_index(in_RCX,(idx_t)local_40);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValidUnsafe
                        (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (bVar1) {
        phVar4 = (hugeint_t *)(in_RDI + iVar3 * 0x10);
        in_stack_ffffffffffffffa8 = phVar4->lower;
        in_stack_ffffffffffffffb0 = (TemplatedValidityMask<unsigned_long> *)phVar4->upper;
        uVar2 = GenericUnaryWrapper::
                Operation<duckdb::UnaryStringOperator<duckdb::ExtractVersionUuidOperator>,duckdb::hugeint_t,unsigned_int>
                          (*phVar4,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                           in_stack_ffffffffffffff90);
        *(uint *)(in_RSI + (long)local_40 * 4) = uVar2;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}